

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_pss.cc
# Opt level: O0

int x509_print_rsa_pss_params(BIO *bp,X509_ALGOR *sigalg,int indent,ASN1_PCTX *pctx)

{
  int iVar1;
  RSA_PSS_PARAMS *a;
  RSA_PSS_PARAMS *pss;
  X509_ALGOR *maskHash;
  int rv;
  ASN1_PCTX *pctx_local;
  int indent_local;
  X509_ALGOR *sigalg_local;
  BIO *bp_local;
  
  iVar1 = OBJ_obj2nid((ASN1_OBJECT *)sigalg->algorithm);
  if (iVar1 != 0x390) {
    __assert_fail("OBJ_obj2nid(sigalg->algorithm) == NID_rsassaPss",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/rsa_pss.cc"
                  ,0x117,
                  "int x509_print_rsa_pss_params(BIO *, const X509_ALGOR *, int, ASN1_PCTX *)");
  }
  maskHash._4_4_ = 0;
  pss = (RSA_PSS_PARAMS *)0x0;
  a = rsa_pss_decode(sigalg);
  if (a == (RSA_PSS_PARAMS *)0x0) {
    iVar1 = BIO_puts((BIO *)bp," (INVALID PSS PARAMETERS)\n");
    if (0 < iVar1) {
      maskHash._4_4_ = 1;
    }
  }
  else {
    iVar1 = BIO_puts((BIO *)bp,"\n");
    if (((0 < iVar1) && (iVar1 = BIO_indent((BIO *)bp,indent,0x80), iVar1 != 0)) &&
       (iVar1 = BIO_puts((BIO *)bp,"Hash Algorithm: "), 0 < iVar1)) {
      if (a->hashAlgorithm == (X509_ALGOR *)0x0) {
        iVar1 = BIO_puts((BIO *)bp,"sha1 (default)");
      }
      else {
        iVar1 = i2a_ASN1_OBJECT((BIO *)bp,(ASN1_OBJECT *)a->hashAlgorithm->algorithm);
      }
      if (((0 < iVar1) && (iVar1 = BIO_puts((BIO *)bp,"\n"), 0 < iVar1)) &&
         ((iVar1 = BIO_indent((BIO *)bp,indent,0x80), iVar1 != 0 &&
          (iVar1 = BIO_puts((BIO *)bp,"Mask Algorithm: "), 0 < iVar1)))) {
        if (a->maskGenAlgorithm == (X509_ALGOR *)0x0) {
          iVar1 = BIO_puts((BIO *)bp,"mgf1 with sha1 (default)");
        }
        else {
          pss = (RSA_PSS_PARAMS *)rsa_mgf1_decode(a->maskGenAlgorithm);
          if (pss == (RSA_PSS_PARAMS *)0x0) {
            iVar1 = BIO_puts((BIO *)bp,"INVALID");
          }
          else {
            iVar1 = i2a_ASN1_OBJECT((BIO *)bp,(ASN1_OBJECT *)a->maskGenAlgorithm->algorithm);
            if ((iVar1 < 1) || (iVar1 = BIO_puts((BIO *)bp," with "), iVar1 < 1)) goto LAB_0081b334;
            iVar1 = i2a_ASN1_OBJECT((BIO *)bp,(ASN1_OBJECT *)pss->hashAlgorithm);
          }
        }
        if (0 < iVar1) {
          BIO_puts((BIO *)bp,"\n");
          iVar1 = BIO_indent((BIO *)bp,indent,0x80);
          if ((iVar1 != 0) && (iVar1 = BIO_puts((BIO *)bp,"Salt Length: 0x"), 0 < iVar1)) {
            if (a->saltLength == (ASN1_INTEGER *)0x0) {
              iVar1 = BIO_puts((BIO *)bp,"14 (default)");
            }
            else {
              iVar1 = i2a_ASN1_INTEGER((BIO *)bp,(ASN1_INTEGER *)a->saltLength);
            }
            if (0 < iVar1) {
              BIO_puts((BIO *)bp,"\n");
              iVar1 = BIO_indent((BIO *)bp,indent,0x80);
              if ((iVar1 != 0) && (iVar1 = BIO_puts((BIO *)bp,"Trailer Field: 0x"), 0 < iVar1)) {
                if (a->trailerField == (ASN1_INTEGER *)0x0) {
                  iVar1 = BIO_puts((BIO *)bp,"BC (default)");
                }
                else {
                  iVar1 = i2a_ASN1_INTEGER((BIO *)bp,(ASN1_INTEGER *)a->trailerField);
                }
                if (0 < iVar1) {
                  BIO_puts((BIO *)bp,"\n");
                  maskHash._4_4_ = 1;
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0081b334:
  RSA_PSS_PARAMS_free((RSA_PSS_PARAMS *)a);
  X509_ALGOR_free((X509_ALGOR *)pss);
  return maskHash._4_4_;
}

Assistant:

int x509_print_rsa_pss_params(BIO *bp, const X509_ALGOR *sigalg, int indent,
                              ASN1_PCTX *pctx) {
  assert(OBJ_obj2nid(sigalg->algorithm) == NID_rsassaPss);

  int rv = 0;
  X509_ALGOR *maskHash = NULL;
  RSA_PSS_PARAMS *pss = rsa_pss_decode(sigalg);
  if (!pss) {
    if (BIO_puts(bp, " (INVALID PSS PARAMETERS)\n") <= 0) {
      goto err;
    }
    rv = 1;
    goto err;
  }

  if (BIO_puts(bp, "\n") <= 0 ||       //
      !BIO_indent(bp, indent, 128) ||  //
      BIO_puts(bp, "Hash Algorithm: ") <= 0) {
    goto err;
  }

  if (pss->hashAlgorithm) {
    if (i2a_ASN1_OBJECT(bp, pss->hashAlgorithm->algorithm) <= 0) {
      goto err;
    }
  } else if (BIO_puts(bp, "sha1 (default)") <= 0) {
    goto err;
  }

  if (BIO_puts(bp, "\n") <= 0 ||       //
      !BIO_indent(bp, indent, 128) ||  //
      BIO_puts(bp, "Mask Algorithm: ") <= 0) {
    goto err;
  }

  if (pss->maskGenAlgorithm) {
    maskHash = rsa_mgf1_decode(pss->maskGenAlgorithm);
    if (maskHash == NULL) {
      if (BIO_puts(bp, "INVALID") <= 0) {
        goto err;
      }
    } else {
      if (i2a_ASN1_OBJECT(bp, pss->maskGenAlgorithm->algorithm) <= 0 ||
          BIO_puts(bp, " with ") <= 0 ||
          i2a_ASN1_OBJECT(bp, maskHash->algorithm) <= 0) {
        goto err;
      }
    }
  } else if (BIO_puts(bp, "mgf1 with sha1 (default)") <= 0) {
    goto err;
  }
  BIO_puts(bp, "\n");

  if (!BIO_indent(bp, indent, 128) ||  //
      BIO_puts(bp, "Salt Length: 0x") <= 0) {
    goto err;
  }

  if (pss->saltLength) {
    if (i2a_ASN1_INTEGER(bp, pss->saltLength) <= 0) {
      goto err;
    }
  } else if (BIO_puts(bp, "14 (default)") <= 0) {
    goto err;
  }
  BIO_puts(bp, "\n");

  if (!BIO_indent(bp, indent, 128) ||  //
      BIO_puts(bp, "Trailer Field: 0x") <= 0) {
    goto err;
  }

  if (pss->trailerField) {
    if (i2a_ASN1_INTEGER(bp, pss->trailerField) <= 0) {
      goto err;
    }
  } else if (BIO_puts(bp, "BC (default)") <= 0) {
    goto err;
  }
  BIO_puts(bp, "\n");

  rv = 1;

err:
  RSA_PSS_PARAMS_free(pss);
  X509_ALGOR_free(maskHash);
  return rv;
}